

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,ExpressionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  bool bVar1;
  int iVar2;
  SubroutineKind SVar3;
  bitmask<slang::ast::StatementFlags> *this;
  CompilationOptions *pCVar4;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  CallExpression *pCVar6;
  Type *this_00;
  Diagnostic *this_01;
  AssignmentExpression *pAVar7;
  UnaryExpression *pUVar8;
  string_view arg;
  byte local_c9;
  UnaryExpression *unary;
  TimingControl *timing;
  SubroutineKind subKind;
  bool ok;
  Compilation *local_60;
  ExpressionStatement *result;
  Expression *local_50;
  Expression *expr;
  bitmask<slang::ast::StatementFlags> local_3c;
  bitmask<slang::ast::ASTFlags> local_38;
  bitmask<slang::ast::ASTFlags> extraFlags;
  StatementContext *stmtCtx_local;
  ASTContext *context_local;
  ExpressionStatementSyntax *syntax_local;
  Compilation *compilation_local;
  
  extraFlags.m_bits = (underlying_type)stmtCtx;
  local_38 = ast::operator|(AssignmentAllowed,TopLevelStatement);
  this = (bitmask<slang::ast::StatementFlags> *)(extraFlags.m_bits + 0x10);
  bitmask<slang::ast::StatementFlags>::bitmask(&local_3c,InForLoop);
  bVar1 = bitmask<slang::ast::StatementFlags>::has(this,&local_3c);
  local_c9 = 0;
  if (bVar1) {
    pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::operator->(&syntax->expr);
    bVar1 = slang::syntax::BinaryExpressionSyntax::isKind((pEVar5->super_SyntaxNode).kind);
    local_c9 = 0;
    if (bVar1) {
      pCVar4 = Compilation::getOptions(compilation);
      local_c9 = pCVar4->strictDriverChecking ^ 0xff;
    }
  }
  if ((local_c9 & 1) != 0) {
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&expr,UnrollableForLoop)
    ;
    bitmask<slang::ast::ASTFlags>::operator|=(&local_38,(bitmask<slang::ast::ASTFlags> *)&expr);
  }
  pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->expr);
  result = (ExpressionStatement *)local_38.m_bits;
  iVar2 = Expression::bind((int)pEVar5,(sockaddr *)context,(socklen_t)local_38.m_bits);
  local_50 = (Expression *)CONCAT44(extraout_var,iVar2);
  _subKind = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  local_60 = (Compilation *)
             BumpAllocator::
             emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,(Expression *)CONCAT44(extraout_var,iVar2)
                        ,(SourceRange *)&subKind);
  bVar1 = Expression::bad(local_50);
  if (bVar1) {
    compilation_local = (Compilation *)Statement::badStmt(compilation,(Statement *)local_60);
  }
  else {
    switch(local_50->kind) {
    case UnaryOp:
      pUVar8 = Expression::as<slang::ast::UnaryExpression>(local_50);
      bVar1 = true;
      if (((pUVar8->op != Preincrement) && (bVar1 = true, pUVar8->op != Predecrement)) &&
         (bVar1 = true, pUVar8->op != Postincrement)) {
        bVar1 = pUVar8->op == Postdecrement;
      }
      break;
    default:
      bVar1 = false;
      break;
    case Assignment:
      pAVar7 = Expression::as<slang::ast::AssignmentExpression>(local_50);
      if (pAVar7->timingControl != (TimingControl *)0x0) {
        Statement::StatementContext::observeTiming
                  ((StatementContext *)extraFlags.m_bits,pAVar7->timingControl);
      }
      bVar1 = true;
      break;
    case Call:
      pCVar6 = Expression::as<slang::ast::CallExpression>(local_50);
      SVar3 = CallExpression::getSubroutineKind(pCVar6);
      this_00 = not_null<const_slang::ast::Type_*>::operator->(&local_50->type);
      bVar1 = Type::isVoid(this_00);
      if ((!bVar1) && (SVar3 == Function)) {
        this_01 = ASTContext::addDiag(context,(DiagCode)0x510008,local_50->sourceRange);
        pCVar6 = Expression::as<slang::ast::CallExpression>(local_50);
        arg = CallExpression::getSubroutineName(pCVar6);
        Diagnostic::operator<<(this_01,arg);
      }
      bVar1 = true;
      break;
    case NewClass:
      bVar1 = true;
    }
    if (bVar1) {
      compilation_local = local_60;
    }
    else {
      ASTContext::addDiag(context,(DiagCode)0x140008,local_50->sourceRange);
      compilation_local = (Compilation *)Statement::badStmt(compilation,(Statement *)local_60);
    }
  }
  return (Statement *)compilation_local;
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const ExpressionStatementSyntax& syntax,
                                           const ASTContext& context, StatementContext& stmtCtx) {
    bitmask<ASTFlags> extraFlags = ASTFlags::AssignmentAllowed | ASTFlags::TopLevelStatement;
    if (stmtCtx.flags.has(StatementFlags::InForLoop) &&
        BinaryExpressionSyntax::isKind(syntax.expr->kind) &&
        !compilation.getOptions().strictDriverChecking) {
        extraFlags |= ASTFlags::UnrollableForLoop;
    }

    auto& expr = Expression::bind(*syntax.expr, context, extraFlags);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    // Only a subset of expressions are allowed as statements.
    bool ok;
    switch (expr.kind) {
        case ExpressionKind::Call: {
            auto subKind = expr.as<CallExpression>().getSubroutineKind();
            if (!expr.type->isVoid() && subKind == SubroutineKind::Function) {
                context.addDiag(diag::UnusedResult, expr.sourceRange)
                    << expr.as<CallExpression>().getSubroutineName();
            }
            ok = true;
            break;
        }
        case ExpressionKind::Assignment:
            if (auto timing = expr.as<AssignmentExpression>().timingControl)
                stmtCtx.observeTiming(*timing);

            ok = true;
            break;
        case ExpressionKind::NewClass:
            ok = true;
            break;
        case ExpressionKind::UnaryOp: {
            auto& unary = expr.as<UnaryExpression>();
            ok = unary.op == UnaryOperator::Preincrement ||
                 unary.op == UnaryOperator::Predecrement ||
                 unary.op == UnaryOperator::Postincrement ||
                 unary.op == UnaryOperator::Postdecrement;
            break;
        }
        default:
            ok = false;
            break;
    }

    if (!ok) {
        context.addDiag(diag::ExprNotStatement, expr.sourceRange);
        return badStmt(compilation, result);
    }

    return *result;
}